

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::UdpDeclarationSyntax::UdpDeclarationSyntax
          (UdpDeclarationSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes
          ,Token primitive,Token name,UdpPortListSyntax *portList,UdpBodySyntax *body,
          Token endprimitive,NamedBlockClauseSyntax *endBlockName)

{
  size_type sVar1;
  pointer ppAVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  
  uVar6 = name._0_8_;
  uVar5 = primitive._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.kind = UdpDeclaration;
  SVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       data_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00508348;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar7 = 0;
    do {
      **(undefined8 **)((long)ppAVar2 + lVar7) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  (this->primitive).kind = (short)uVar5;
  (this->primitive).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->primitive).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->primitive).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->primitive).info = primitive.info;
  (this->name).kind = (short)uVar6;
  (this->name).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->name).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->name).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->name).info = name.info;
  (this->portList).ptr = portList;
  (this->body).ptr = body;
  (this->endprimitive).kind = endprimitive.kind;
  (this->endprimitive).field_0x2 = endprimitive._2_1_;
  (this->endprimitive).numFlags = (NumericTokenFlags)endprimitive.numFlags.raw;
  (this->endprimitive).rawLen = endprimitive.rawLen;
  (this->endprimitive).info = endprimitive.info;
  this->endBlockName = endBlockName;
  (portList->super_SyntaxNode).parent = (SyntaxNode *)this;
  (body->super_SyntaxNode).parent = (SyntaxNode *)this;
  if (endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

UdpDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token primitive, Token name, UdpPortListSyntax& portList, UdpBodySyntax& body, Token endprimitive, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(SyntaxKind::UdpDeclaration, attributes), primitive(primitive), name(name), portList(&portList), body(&body), endprimitive(endprimitive), endBlockName(endBlockName) {
        this->portList->parent = this;
        this->body->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }